

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonteCarloPricer.h
# Opt level: O3

PriceCI * __thiscall
MonteCarloPricer::priceClassic<DigitalPut>
          (PriceCI *__return_storage_ptr__,MonteCarloPricer *this,BlackScholesModel *model,
          DigitalPut *option)

{
  double dVar1;
  double dVar2;
  PriceCI *pPVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  double dVar6;
  double dVar7;
  double local_60;
  double local_58;
  PriceCI *local_50;
  undefined1 local_48 [16];
  
  iVar4 = this->num_sims;
  local_50 = __return_storage_ptr__;
  if (iVar4 < 1) {
    dVar7 = 0.0;
    dVar6 = 0.0;
  }
  else {
    dVar6 = 0.0;
    iVar5 = 0;
    dVar7 = 0.0;
    do {
      local_60 = Option::getMaturity((Option *)option);
      local_58 = BlackScholesModel::generatePrice(model,&local_60);
      (*(option->super_PathIndependentOption).super_Option._vptr_Option[1])(option,&local_58);
      dVar7 = dVar7 + (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      dVar6 = dVar6 + (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) *
                      (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      iVar5 = iVar5 + 1;
      iVar4 = this->num_sims;
    } while (iVar5 < iVar4);
  }
  dVar7 = dVar7 / (double)iVar4;
  dVar1 = BlackScholesModel::getRiskFreeRate(model);
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_8_ = -dVar1;
  local_48._12_4_ = extraout_XMM0_Dd ^ 0x80000000;
  dVar1 = Option::getMaturity((Option *)option);
  local_58 = exp(dVar1 * (double)local_48._0_8_);
  local_58 = local_58 * dVar7;
  dVar1 = BlackScholesModel::getRiskFreeRate(model);
  dVar2 = Option::getMaturity((Option *)option);
  local_60 = exp(dVar2 * dVar1 * -2.0);
  pPVar3 = local_50;
  local_60 = local_60 * (dVar6 / (double)iVar4 - dVar7 * dVar7);
  PriceCI::PriceCI(local_50,&local_58,&local_60,&this->num_sims);
  return pPVar3;
}

Assistant:

inline PriceCI MonteCarloPricer::priceClassic(BlackScholesModel const& model, pathIndependentOption const& option) const
{
	double payoff, payoff_sum = 0.0, payoff_sq_mean = 0.0;
	for (int i = 0; i < num_sims; i++) {
		payoff = option.payoff(model.generatePrice(option.getMaturity()));
		payoff_sum += payoff;
		payoff_sq_mean += payoff * payoff;
	}
	double payoff_mean = payoff_sum / static_cast<double>(num_sims);
	double payoff_std = (payoff_sq_mean / static_cast<double>(num_sims)) - payoff_mean * payoff_mean;
	payoff_mean *= exp(-model.getRiskFreeRate() * option.getMaturity());
	payoff_std *= exp(-2 * model.getRiskFreeRate() * option.getMaturity());
	return { payoff_mean, payoff_std, num_sims };
}